

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableModel.cpp
# Opt level: O0

TableModel<trackerboy::Instrument> * __thiscall
TableModel<trackerboy::Instrument>::iconData(TableModel<trackerboy::Instrument> *this,int id)

{
  ChType CVar1;
  Table<trackerboy::Instrument> *this_00;
  Instrument *this_01;
  int in_EDX;
  undefined4 in_register_00000034;
  undefined4 local_24;
  Icons icons;
  ChType ch;
  int id_local;
  TableModel<trackerboy::Instrument> *this_local;
  
  this_00 = source((TableModel<trackerboy::Instrument> *)CONCAT44(in_register_00000034,id));
  this_01 = trackerboy::Table<trackerboy::Instrument>::get(this_00,in_EDX);
  CVar1 = trackerboy::Instrument::channel(this_01);
  if (CVar1 == ch1) {
    local_24 = ch1;
  }
  else if (CVar1 == ch2) {
    local_24 = ch2;
  }
  else if (CVar1 == ch3) {
    local_24 = ch3;
  }
  else {
    local_24 = ch4;
  }
  IconLocator::get((IconLocator *)this,local_24);
  return this;
}

Assistant:

QIcon TableModel<T>::iconData(int id) const {
    if constexpr (std::is_same_v<T, trackerboy::Instrument>) {
        auto ch = source().get(id)->channel();
        Icons icons;
        switch (ch) {
            case trackerboy::ChType::ch1:
                icons = Icons::ch1;
                break;
            case trackerboy::ChType::ch2:
                icons = Icons::ch2;
                break;
            case trackerboy::ChType::ch3:
                icons = Icons::ch3;
                break;
            default:
                icons = Icons::ch4;
                break;

        }

        return IconLocator::get(icons);
    } else {
        // no icons for waveforms (yet, potential TODO)
        Q_UNUSED(id);
        return {};
    }
}